

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<long>::Clear
          (RepeatedFieldWrapper<long> *this,Field *data)

{
  RepeatedField<long> *this_00;
  
  this_00 = (RepeatedField<long> *)(**(code **)(*(long *)this + 0x88))();
  RepeatedField<long>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }